

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceTests.cpp
# Opt level: O2

Model * addOptionalField(Model *model,string *name)

{
  ulong uVar1;
  ModelDescription *pMVar2;
  FeatureDescription *this;
  FeatureType *pFVar3;
  undefined8 *puVar4;
  
  pMVar2 = CoreML::Specification::Model::_internal_mutable_description(model);
  this = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                   (&pMVar2->input_);
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  puVar4 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar4 = (undefined8 *)*puVar4;
  }
  google::protobuf::internal::ArenaStringPtr::Set(&this->name_,name,puVar4);
  pFVar3 = CoreML::Specification::FeatureDescription::_internal_mutable_type(this);
  CoreML::Specification::FeatureType::_internal_mutable_int64type(pFVar3);
  pFVar3 = CoreML::Specification::FeatureDescription::_internal_mutable_type(this);
  pFVar3->isoptional_ = true;
  return model;
}

Assistant:

static Specification::Model& addOptionalField(Specification::Model& model, const std::string& name) {
    auto *input = model.mutable_description()->add_input();
    input->set_name(name);
    input->mutable_type()->mutable_int64type();
    input->mutable_type()->set_isoptional(true);
    return model;
}